

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::status_internal::StatusRep::operator==(StatusRep *this,StatusRep *other)

{
  size_t sVar1;
  ulong uVar2;
  Storage<unsigned_long,_1UL,_false> SVar3;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar4;
  bool bVar5;
  int iVar6;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar7;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar8;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar9;
  ulong uVar10;
  size_t size_to_compare;
  bool bVar11;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Payload *payload;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar17;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar18;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar19;
  Cord *rhs;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar20;
  undefined1 auVar21 [16];
  Payloads no_payloads;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  local_68;
  
  if (this == other) {
    __assert_fail("this != &other",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/status/internal/status_internal.cc"
                  ,0x9e,"bool absl::status_internal::StatusRep::operator==(const StatusRep &) const"
                 );
  }
  if (((this->code_ == other->code_) &&
      (sVar1 = (this->message_)._M_string_length, sVar1 == (other->message_)._M_string_length)) &&
     ((sVar1 == 0 ||
      (iVar6 = bcmp((this->message_)._M_dataplus._M_p,(other->message_)._M_dataplus._M_p,sVar1),
      iVar6 == 0)))) {
    pSVar8 = &((this->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    pSVar9 = &((other->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    local_68.metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          )(Storage<unsigned_long,_1UL,_false>)0x0;
    pSVar20 = pSVar8;
    if (pSVar8 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                   *)0x0) {
      pSVar20 = &local_68;
    }
    pSVar12 = pSVar9;
    if (pSVar9 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                   *)0x0) {
      pSVar12 = &local_68;
    }
    uVar10 = (pSVar20->metadata_).
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
             .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar15 = uVar10 >> 1;
    uVar2 = (pSVar12->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar16 = uVar2 >> 1;
    uVar14 = uVar2;
    if (uVar15 < uVar16) {
      uVar14 = uVar10;
      uVar10 = uVar2;
    }
    if ((uVar10 >> 1) - (uVar14 >> 1) < 2) {
      if (pSVar9 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)0x0) {
        pSVar9 = &local_68;
      }
      if (pSVar8 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)0x0) {
        pSVar8 = &local_68;
      }
      pPVar17 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                &pSVar8->data_;
      pSVar4 = pSVar8;
      if (uVar15 < uVar16) {
        pPVar17 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                  &pSVar9->data_;
        pSVar4 = pSVar9;
      }
      if ((uVar10 & 1) != 0) {
        pPVar17 = (pSVar4->data_).allocated.allocated_data;
      }
      bVar11 = true;
      if (1 < uVar10) {
        pPVar7 = pPVar17 + (uVar10 >> 1);
        pPVar18 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                  &pSVar9->data_;
        if (uVar15 < uVar16) {
          pPVar18 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                    &pSVar8->data_;
        }
        do {
          pSVar8 = pSVar12;
          if (uVar15 < uVar16) {
            pSVar8 = pSVar20;
          }
          SVar3.value = (pSVar8->metadata_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                        .super_Storage<unsigned_long,_1UL,_false>.value;
          pPVar19 = pPVar18;
          if ((SVar3.value & 1) != 0) {
            pPVar19 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                      (pPVar18->type_url)._M_dataplus._M_p;
          }
          if (SVar3.value < 2) goto LAB_0049cf34;
          sVar1 = (pPVar17->type_url)._M_string_length;
          rhs = &pPVar19->payload;
          lVar13 = (SVar3.value >> 1) * 0x30;
          while ((sVar1 != (((Payload *)(rhs + -2))->type_url)._M_string_length ||
                 ((sVar1 != 0 &&
                  (iVar6 = bcmp((pPVar17->type_url)._M_dataplus._M_p,
                                (((Payload *)(rhs + -2))->type_url)._M_dataplus._M_p,sVar1),
                  iVar6 != 0))))) {
            rhs = rhs + 3;
            lVar13 = lVar13 + -0x30;
            if (lVar13 == 0) goto LAB_0049cf34;
          }
          auVar21[0] = -((rhs->contents_).data_.rep_.field_0.data[0] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[0]);
          auVar21[1] = -((rhs->contents_).data_.rep_.field_0.data[1] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[1]);
          auVar21[2] = -((rhs->contents_).data_.rep_.field_0.data[2] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[2]);
          auVar21[3] = -((rhs->contents_).data_.rep_.field_0.data[3] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[3]);
          auVar21[4] = -((rhs->contents_).data_.rep_.field_0.data[4] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[4]);
          auVar21[5] = -((rhs->contents_).data_.rep_.field_0.data[5] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[5]);
          auVar21[6] = -((rhs->contents_).data_.rep_.field_0.data[6] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[6]);
          auVar21[7] = -((rhs->contents_).data_.rep_.field_0.data[7] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[7]);
          auVar21[8] = -((rhs->contents_).data_.rep_.field_0.data[8] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[8]);
          auVar21[9] = -((rhs->contents_).data_.rep_.field_0.data[9] ==
                        (pPVar17->payload).contents_.data_.rep_.field_0.data[9]);
          auVar21[10] = -((rhs->contents_).data_.rep_.field_0.data[10] ==
                         (pPVar17->payload).contents_.data_.rep_.field_0.data[10]);
          auVar21[0xb] = -((rhs->contents_).data_.rep_.field_0.data[0xb] ==
                          (pPVar17->payload).contents_.data_.rep_.field_0.data[0xb]);
          auVar21[0xc] = -((rhs->contents_).data_.rep_.field_0.data[0xc] ==
                          (pPVar17->payload).contents_.data_.rep_.field_0.data[0xc]);
          auVar21[0xd] = -((rhs->contents_).data_.rep_.field_0.data[0xd] ==
                          (pPVar17->payload).contents_.data_.rep_.field_0.data[0xd]);
          auVar21[0xe] = -((rhs->contents_).data_.rep_.field_0.data[0xe] ==
                          (pPVar17->payload).contents_.data_.rep_.field_0.data[0xe]);
          auVar21[0xf] = -((rhs->contents_).data_.rep_.field_0.data[0xf] ==
                          (pPVar17->payload).contents_.data_.rep_.field_0.data[0xf]);
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
            uVar10 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
            if ((uVar10 & 1) == 0) {
              size_to_compare = uVar10 >> 1;
            }
            else {
              size_to_compare = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
            }
            uVar10 = (ulong)(pPVar17->payload).contents_.data_.rep_.field_0.data[0];
            if ((uVar10 & 1) == 0) {
              uVar10 = uVar10 >> 1;
            }
            else {
              uVar10 = ((pPVar17->payload).contents_.data_.rep_.field_0.as_tree.rep)->length;
            }
            if ((uVar10 != size_to_compare) ||
               (bVar5 = Cord::EqualsImpl(&pPVar17->payload,rhs,size_to_compare), !bVar5))
            goto LAB_0049cf34;
          }
          pPVar17 = pPVar17 + 1;
        } while (pPVar17 != pPVar7);
      }
    }
    else {
LAB_0049cf34:
      bVar11 = false;
    }
    inlined_vector_internal::
    Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
    ::~Storage(&local_68);
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool StatusRep::operator==(const StatusRep& other) const {
  assert(this != &other);
  if (code_ != other.code_) return false;
  if (message_ != other.message_) return false;
  const status_internal::Payloads* this_payloads = payloads_.get();
  const status_internal::Payloads* other_payloads = other.payloads_.get();

  const status_internal::Payloads no_payloads;
  const status_internal::Payloads* larger_payloads =
      this_payloads ? this_payloads : &no_payloads;
  const status_internal::Payloads* smaller_payloads =
      other_payloads ? other_payloads : &no_payloads;
  if (larger_payloads->size() < smaller_payloads->size()) {
    std::swap(larger_payloads, smaller_payloads);
  }
  if ((larger_payloads->size() - smaller_payloads->size()) > 1) return false;
  // Payloads can be ordered differently, so we can't just compare payload
  // vectors.
  for (const auto& payload : *larger_payloads) {

    bool found = false;
    for (const auto& other_payload : *smaller_payloads) {
      if (payload.type_url == other_payload.type_url) {
        if (payload.payload != other_payload.payload) {
          return false;
        }
        found = true;
        break;
      }
    }
    if (!found) return false;
  }
  return true;
}